

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_ffi_tapi.cpp
# Opt level: O1

void tqapi_tapi_free_query_positions_result(TradeApi *tapi,QueryPositionsResult *result)

{
  QueryPositionsResultData *pQVar1;
  pointer pPVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  
  pQVar1 = result->_data;
  if (pQVar1 != (QueryPositionsResultData *)0x0) {
    pPVar2 = (pQVar1->positions).super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pPVar2 != (pointer)0x0) {
      operator_delete(pPVar2);
    }
    pcVar3 = (pQVar1->result).msg._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != &(pQVar1->result).msg.field_2) {
      operator_delete(pcVar3);
    }
    this = (pQVar1->result).value.
           super___shared_ptr<const_std::vector<tquant::api::Position,_std::allocator<tquant::api::Position>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    operator_delete(pQVar1);
  }
  operator_delete(result);
  return;
}

Assistant:

void tqapi_tapi_free_query_positions_result (TradeApi* tapi, QueryPositionsResult* result)
    {
        delete result->_data;
        delete result;
    }